

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

FundRawTransactionResponse * __thiscall
cfd::js::api::json::FundRawTransactionResponse::GetHexString_abi_cxx11_
          (FundRawTransactionResponse *this,FundRawTransactionResponse *obj)

{
  FundRawTransactionResponse *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->hex_);
  return this;
}

Assistant:

static std::string GetHexString(  // line separate
      const FundRawTransactionResponse& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.hex_);
  }